

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O3

int PackBitsDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  uint8_t *puVar3;
  ulong uVar4;
  tmsize_t tVar5;
  
  puVar3 = tif->tif_rawcp;
  uVar4 = tif->tif_rawcc;
  do {
    if (((long)uVar4 < 1) || (occ < 1)) {
      tif->tif_rawcp = puVar3;
      tif->tif_rawcc = uVar4;
      if (occ < 1) {
        iVar2 = 1;
      }
      else {
LAB_002aac7b:
        iVar2 = 0;
        TIFFErrorExtR(tif,"PackBitsDecode","Not enough data for scanline %u",(ulong)tif->tif_row);
      }
      return iVar2;
    }
    uVar1 = (ulong)(char)*puVar3;
    if ((long)uVar1 < 0) {
      __n = 1 - uVar1;
      if ((ulong)occ < 1 - uVar1) {
        TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun");
        __n = occ;
      }
      if (uVar4 == 1) {
        tVar5 = 0;
LAB_002aacc3:
        TIFFWarningExtR(tif,"PackBitsDecode","Terminating PackBitsDecode due to lack of data.");
        tif->tif_rawcp = puVar3 + 1;
        tif->tif_rawcc = tVar5;
        goto LAB_002aac7b;
      }
      memset(op,(uint)puVar3[1],__n);
    }
    else {
      if ((ulong)occ <= uVar1) {
        TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun",
                        (uVar1 - occ) + 1);
        uVar1 = occ - 1;
      }
      __n = uVar1 + 1;
      if (uVar4 <= __n) {
        tVar5 = uVar4 - 1;
        goto LAB_002aacc3;
      }
      _TIFFmemcpy(op,puVar3 + 1,__n);
      puVar3 = puVar3 + uVar1;
      uVar4 = uVar4 - uVar1;
    }
    uVar4 = uVar4 - 2;
    puVar3 = puVar3 + 2;
    op = op + __n;
    occ = occ - __n;
  } while( true );
}

Assistant:

static int PackBitsDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PackBitsDecode";
    int8_t *bp;
    tmsize_t cc;
    long n;
    int b;

    (void)s;
    bp = (int8_t *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    while (cc > 0 && occ > 0)
    {
        n = (long)*bp++;
        cc--;
        if (n < 0)
        {                  /* replicate next byte -n+1 times */
            if (n == -128) /* nop */
                continue;
            n = -n + 1;
            if (occ < (tmsize_t)n)
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ);
                n = (long)occ;
            }
            if (cc == 0)
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            occ -= n;
            b = *bp++;
            cc--;
            while (n-- > 0)
                *op++ = (uint8_t)b;
        }
        else
        { /* copy next n+1 bytes literally */
            if (occ < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ + 1);
                n = (long)occ - 1;
            }
            if (cc < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            _TIFFmemcpy(op, bp, ++n);
            op += n;
            occ -= n;
            bp += n;
            cc -= n;
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (occ > 0)
    {
        TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                      tif->tif_row);
        return (0);
    }
    return (1);
}